

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall
Lodtalk::AST::IdentifierExpression::IdentifierExpression
          (IdentifierExpression *this,string *identifier)

{
  pointer pcVar1;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__IdentifierExpression_00163de8;
  (this->identifier)._M_dataplus._M_p = (pointer)&(this->identifier).field_2;
  pcVar1 = (identifier->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->identifier,pcVar1,pcVar1 + identifier->_M_string_length);
  (this->variable).super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->variable).super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

IdentifierExpression::IdentifierExpression(const std::string &identifier)
	: identifier(identifier)
{
}